

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O0

void fsg_history_entry_add
               (fsg_history_t *h,fsg_link_t *link,int32 frame,int32 score,int32 pred,int32 lc,
               fsg_pnode_ctxt_t rc)

{
  int iVar1;
  long lVar2;
  void *ptr;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined8 uVar6;
  uint32 uVar7;
  uint uVar8;
  undefined8 *puVar9;
  glist_t pgVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  gnode_t *local_50;
  gnode_t *prev_gn;
  gnode_t *gn;
  int32 s;
  fsg_hist_entry_t *new_entry;
  fsg_hist_entry_t *entry;
  int32 lc_local;
  int32 pred_local;
  int32 score_local;
  int32 frame_local;
  fsg_link_t *link_local;
  fsg_history_t *h_local;
  
  if (frame < 0) {
    puVar9 = (undefined8 *)
             __ckd_calloc__(1,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                            ,0x92);
    *puVar9 = link;
    *(int32 *)(puVar9 + 2) = frame;
    *(int32 *)(puVar9 + 1) = score;
    *(int32 *)((long)puVar9 + 0xc) = pred;
    *(short *)((long)puVar9 + 0x14) = (short)lc;
    puVar9[3] = rc.bv._0_8_;
    puVar9[4] = rc.bv._8_8_;
    blkarray_list_append(h->entries,puVar9);
  }
  else {
    iVar1 = link->to_state;
    local_50 = (gnode_t *)0x0;
    prev_gn = h->frame_entries[iVar1][lc];
    while( true ) {
      uVar6 = rc.bv._8_8_;
      uVar3 = rc.bv[0];
      uVar4 = rc.bv[1];
      uVar5 = rc.bv[2];
      uVar7 = rc.bv[3];
      if ((prev_gn == (gnode_t *)0x0) || (lVar2 = (prev_gn->data).i, *(int *)(lVar2 + 8) < score))
      break;
      uVar8 = (*(uint *)(lVar2 + 0x18) ^ 0xffffffff) & rc.bv[0];
      rc.bv[0] = uVar8;
      if (((uVar8 == 0 && ((*(uint *)(lVar2 + 0x1c) ^ 0xffffffff) & uVar4) == 0) &&
          ((*(uint *)(lVar2 + 0x20) ^ 0xffffffff) & uVar5) == 0) &&
          ((*(uint *)(lVar2 + 0x24) ^ 0xffffffff) & uVar7) == 0) {
        return;
      }
      local_50 = prev_gn;
      prev_gn = prev_gn->next;
    }
    puVar9 = (undefined8 *)
             __ckd_calloc__(1,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                            ,0xb1);
    *puVar9 = link;
    *(int32 *)(puVar9 + 2) = frame;
    *(int32 *)(puVar9 + 1) = score;
    *(int32 *)((long)puVar9 + 0xc) = pred;
    *(short *)((long)puVar9 + 0x14) = (short)lc;
    puVar9[3] = rc.bv._0_8_;
    puVar9[4] = uVar6;
    if (local_50 == (gnode_t *)0x0) {
      pgVar10 = glist_add_ptr(h->frame_entries[iVar1][lc],puVar9);
      h->frame_entries[iVar1][lc] = pgVar10;
      local_50 = h->frame_entries[iVar1][lc];
    }
    else {
      local_50 = glist_insert_ptr(local_50,puVar9);
    }
    while (prev_gn != (gnode_t *)0x0) {
      ptr = (prev_gn->data).ptr;
      uVar8 = (uVar3 ^ 0xffffffff) & *(uint *)((long)ptr + 0x18);
      *(uint *)((long)ptr + 0x18) = uVar8;
      uVar12 = (uVar4 ^ 0xffffffff) & *(uint *)((long)ptr + 0x1c);
      *(uint *)((long)ptr + 0x1c) = uVar12;
      uVar13 = (rc.bv[2] ^ 0xffffffff) & *(uint *)((long)ptr + 0x20);
      *(uint *)((long)ptr + 0x20) = uVar13;
      uVar11 = (rc.bv[3] ^ 0xffffffff) & *(uint *)((long)ptr + 0x24);
      *(uint *)((long)ptr + 0x24) = uVar11;
      if (((uVar8 == 0 && uVar12 == 0) && uVar13 == 0) && uVar11 == 0) {
        ckd_free(ptr);
        prev_gn = gnode_free(prev_gn,local_50);
      }
      else {
        local_50 = prev_gn;
        prev_gn = prev_gn->next;
      }
    }
  }
  return;
}

Assistant:

void
fsg_history_entry_add(fsg_history_t * h,
                      fsg_link_t * link,
                      int32 frame, int32 score, int32 pred,
                      int32 lc, fsg_pnode_ctxt_t rc)
{
    fsg_hist_entry_t *entry, *new_entry;
    int32 s;
    gnode_t *gn, *prev_gn;

    /* Skip the optimization for the initial dummy entries; always enter them */
    if (frame < 0) {
        new_entry =
            (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
        new_entry->fsglink = link;
        new_entry->frame = frame;
        new_entry->score = score;
        new_entry->pred = pred;
        new_entry->lc = lc;
        new_entry->rc = rc;

        blkarray_list_append(h->entries, (void *) new_entry);
        return;
    }

    s = fsg_link_to_state(link);

    /* Locate where this entry should be inserted in frame_entries[s][lc] */
    prev_gn = NULL;
    for (gn = h->frame_entries[s][lc]; gn; gn = gnode_next(gn)) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (score BETTER_THAN entry->score)
            break;              /* Found where to insert new entry */

        /* Existing entry score not worse than new score */
        if (FSG_PNODE_CTXT_SUB(&rc, &(entry->rc)) == 0)
            return;             /* rc set reduced to 0; new entry can be ignored */

        prev_gn = gn;
    }

    /* Create new entry after prev_gn (if prev_gn is NULL, at head) */
    new_entry =
        (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
    new_entry->fsglink = link;
    new_entry->frame = frame;
    new_entry->score = score;
    new_entry->pred = pred;
    new_entry->lc = lc;
    new_entry->rc = rc;         /* Note: rc set must be non-empty at this point */

    if (!prev_gn) {
        h->frame_entries[s][lc] = glist_add_ptr(h->frame_entries[s][lc],
                                                (void *) new_entry);
        prev_gn = h->frame_entries[s][lc];
    }
    else
        prev_gn = glist_insert_ptr(prev_gn, (void *) new_entry);

    /*
     * Update the rc set of all the remaining entries in the list.  At this
     * point, gn is the entry, if any, immediately following new entry.
     */
    while (gn) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (FSG_PNODE_CTXT_SUB(&(entry->rc), &rc) == 0) {
            /* rc set of entry reduced to 0; can prune this entry */
            ckd_free((void *) entry);
            gn = gnode_free(gn, prev_gn);
        }
        else {
            prev_gn = gn;
            gn = gnode_next(gn);
        }
    }
}